

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O3

void going_set_off_tcp_cork(int sockfd)

{
  uint in_EAX;
  int iVar1;
  int *piVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  socklen_t __len;
  socklen_t *__addr_len;
  int iVar3;
  sockaddr *__addr;
  ulong uVar4;
  ulong uVar5;
  int off;
  long lStack_30;
  code *pcStack_28;
  long lStack_18;
  code *pcStack_10;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  iVar3 = 6;
  pcStack_10 = (code *)0x1068c0;
  iVar1 = setsockopt(sockfd,6,3,(void *)((long)&uStack_8 + 4),4);
  if (-1 < iVar1) {
    return;
  }
  pcStack_10 = going_set_recv_timeo;
  going_set_off_tcp_cork();
  lStack_18 = (long)iVar3;
  pcStack_10 = (code *)(long)extraout_EDX;
  iVar3 = 1;
  pcStack_28 = (code *)0x1068f6;
  iVar1 = setsockopt(sockfd,1,0x14,&lStack_18,0x10);
  if (-1 < iVar1) {
    return;
  }
  pcStack_28 = going_set_snd_timeo;
  going_set_recv_timeo();
  lStack_30 = (long)iVar3;
  pcStack_28 = (code *)(long)extraout_EDX_00;
  iVar1 = setsockopt(sockfd,1,0x15,&lStack_30,0x10);
  if (-1 < iVar1) {
    return;
  }
  going_set_snd_timeo();
  uVar4 = 2;
  __addr = (sockaddr *)0x1;
  iVar1 = socket(2,1,0);
  if (-1 < iVar1) {
    return;
  }
  going_socket();
  iVar1 = listen((int)uVar4,(int)__addr);
  if (iVar1 != -1) {
    return;
  }
  going_listen();
  iVar1 = bind((int)uVar4,__addr,__len);
  if (-1 < iVar1) {
    return;
  }
  going_bind();
  uVar5 = uVar4;
  do {
    iVar1 = accept((int)uVar5,__addr,__addr_len);
    if (0 < iVar1) {
      return;
    }
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 < 0x47) {
        if ((iVar1 != 4) && (iVar1 != 0xb)) {
LAB_001069c3:
          going_accept();
          return;
        }
      }
      else if ((iVar1 != 0x47) && (iVar1 != 0x67)) goto LAB_001069c3;
    }
    uVar5 = uVar4 & 0xffffffff;
  } while( true );
}

Assistant:

void going_set_off_tcp_cork(int sockfd)
 {
 	int off = 0;
 	int ret = setsockopt(sockfd, SOL_TCP, TCP_CORK, &off, sizeof(off));
 	if(ret < 0){
 		log_err("setsockopt: TCP_CORK OFF failed.");
		exit(-1);
 	}
 }